

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::Operation::Operation
          (Operation *this,char *name,bool useSync,bool serverSync)

{
  FenceSync *pFVar1;
  SharedPtrStateBase *pSVar2;
  undefined3 in_register_00000011;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,name);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Operation_003e6ac8;
  this->m_useSync = useSync;
  this->m_serverSync = serverSync;
  (this->m_syncDeps).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_syncDeps).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_syncDeps).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000011,useSync) == 0) {
    (this->m_sync).m_ptr = (FenceSync *)0x0;
    (this->m_sync).m_state = (SharedPtrStateBase *)0x0;
  }
  else {
    pFVar1 = (FenceSync *)operator_new(0x20);
    pFVar1->m_display = (EGLDisplay)0x0;
    pFVar1->m_sync = (EGLSyncKHR)0x0;
    de::Mutex::Mutex(&pFVar1->m_lock,0);
    pFVar1->m_waiterCount = 0;
    pFVar1->m_serverSync = false;
    (this->m_sync).m_state = (SharedPtrStateBase *)0x0;
    (this->m_sync).m_ptr = pFVar1;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_003e7630;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pFVar1;
    (this->m_sync).m_state = pSVar2;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
  }
  return;
}

Assistant:

Operation::Operation (const char* name, bool useSync, bool serverSync)
	: tcu::ThreadUtil::Operation	(name)
	, m_useSync						(useSync)
	, m_serverSync					(serverSync)
	, m_sync						(useSync ? SharedPtr<FenceSync>(new FenceSync()) : SharedPtr<FenceSync>())
{
}